

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_example(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  uint64_t uVar2;
  size_t sVar3;
  size_t sVar4;
  roaring_bitmap_t *r_00;
  uint32_t *ans;
  uint32_t *ans_00;
  roaring_bitmap_t *prVar5;
  uint64_t uVar6;
  roaring_bitmap_t *prVar7;
  roaring_bitmap_t *r_01;
  char *buf;
  roaring_uint32_iterator_t *prVar8;
  byte bVar9;
  uint32_t i;
  uint32_t uVar10;
  ulong uVar11;
  undefined7 in_register_00000039;
  roaring_bitmap_t *allmybitmaps [3];
  uint32_t values [3];
  roaring_bitmap_t *allmybitmaps_x [3];
  uint32_t buffer [256];
  uint local_4bc;
  roaring_bitmap_t *local_4b8;
  undefined4 local_4ac;
  roaring_bitmap_t *local_4a8;
  roaring_bitmap_t *local_4a0;
  roaring_bitmap_t *local_498;
  uint32_t local_488 [4];
  roaring_bitmap_t *local_478;
  roaring_bitmap_t *local_470;
  roaring_bitmap_t *local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  char *local_438 [129];
  
  r = roaring_bitmap_create_with_capacity(0);
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x2d9);
  }
  _assert_true((unsigned_long)r,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x2da);
  uVar10 = 100;
  do {
    roaring_bitmap_add(r,uVar10);
    local_438[0] = (char *)0x0;
    _Var1 = roaring_bitmap_internal_validate(r,local_438);
    if (!_Var1) {
      print_error("ERROR: internal validation failed: %s\n",local_438[0]);
      _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
            ,0x2df);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 1000);
  _Var1 = roaring_bitmap_contains(r,500);
  _assert_true((ulong)_Var1,"roaring_bitmap_contains(r1, 500)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x2e3);
  uVar2 = roaring_bitmap_get_cardinality(r);
  printf("Cardinality = %d \n",uVar2 & 0xffffffff);
  sVar3 = roaring_bitmap_portable_size_in_bytes(r);
  roaring_bitmap_run_optimize(r);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x2ed);
  }
  sVar4 = roaring_bitmap_portable_size_in_bytes(r);
  printf("size before run optimize %d bytes, and after %d bytes\n",sVar3 & 0xffffffff,
         sVar4 & 0xffffffff);
  local_448 = 0x600000005;
  local_458 = 0x100000000;
  uStack_450 = 0x300000002;
  r_00 = roaring_bitmap_of_ptr(5,(uint32_t *)((long)&local_458 + 4));
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r_00,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x2f5);
  }
  _assert_true((unsigned_long)r_00,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x2f6);
  roaring_bitmap_printf(r_00);
  local_488[0] = 2;
  local_488[1] = 3;
  local_488[2] = 4;
  local_4b8 = roaring_bitmap_of_ptr(3,local_488);
  local_4ac = (undefined4)CONCAT71(in_register_00000039,copy_on_write);
  (local_4b8->high_low_container).flags =
       (local_4b8->high_low_container).flags & 0xfe | copy_on_write;
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(local_4b8,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x2fe);
  }
  uVar2 = roaring_bitmap_get_cardinality(r);
  ans = (uint32_t *)malloc(uVar2 * 4);
  _assert_true((ulong)(ans != (uint32_t *)0x0),"arr1 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x303);
  roaring_bitmap_to_uint32_array(r,ans);
  ans_00 = (uint32_t *)malloc(4000);
  _assert_true((ulong)(ans_00 != (uint32_t *)0x0),"arr3 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x30a);
  roaring_bitmap_range_uint32_array(r,100,1000,ans_00);
  free(ans_00);
  prVar5 = roaring_bitmap_of_ptr(uVar2,ans);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x30f);
  }
  free(ans);
  _assert_true((unsigned_long)prVar5,"r1f",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x311);
  _Var1 = roaring_bitmap_equals(r,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, r1f)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x314);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_copy(local_4b8);
  bVar9 = (byte)local_4ac;
  (prVar5->high_low_container).flags = (prVar5->high_low_container).flags & 0xfe | bVar9;
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x31a);
  }
  _Var1 = roaring_bitmap_equals(local_4b8,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r3, z)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x31b);
  roaring_bitmap_free(prVar5);
  prVar5 = roaring_bitmap_or(r,r_00);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x321);
  }
  uVar2 = roaring_bitmap_get_cardinality(prVar5);
  uVar6 = roaring_bitmap_or_cardinality(r,r_00);
  _assert_true((ulong)(uVar2 == uVar6),
               "roaring_bitmap_get_cardinality(r1_2_3) == roaring_bitmap_or_cardinality(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x323);
  prVar7 = local_4b8;
  (prVar5->high_low_container).flags = (prVar5->high_low_container).flags & 0xfe | bVar9;
  roaring_bitmap_or_inplace(prVar5,local_4b8);
  local_498 = prVar7;
  local_4a8 = r;
  local_4a0 = r_00;
  prVar7 = roaring_bitmap_or_many(3,&local_4a8);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar7,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x32b);
  }
  _Var1 = roaring_bitmap_equals(prVar5,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1_2_3, bigunion)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x32c);
  r_01 = roaring_bitmap_or_many_heap(3,&local_4a8);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r_01,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x32f);
  }
  _Var1 = roaring_bitmap_equals(prVar5,r_01);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1_2_3, bigunionheap)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x330);
  roaring_bitmap_free(prVar5);
  roaring_bitmap_free(prVar7);
  roaring_bitmap_free(r_01);
  prVar5 = roaring_bitmap_xor(r,r_00);
  (prVar5->high_low_container).flags = ((prVar5->high_low_container).flags & 0xfe) + (char)local_4ac
  ;
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  local_468 = local_4b8;
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x338);
  }
  roaring_bitmap_xor_inplace(prVar5,local_4b8);
  local_478 = r;
  local_470 = r_00;
  prVar7 = roaring_bitmap_xor_many(3,&local_478);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar7,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x33e);
  }
  _Var1 = roaring_bitmap_equals(prVar5,prVar7);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rx1_2_3, bigxor)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x33f);
  roaring_bitmap_free(prVar5);
  roaring_bitmap_free(prVar7);
  prVar5 = roaring_bitmap_and(r,r_00);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x346);
  }
  uVar2 = roaring_bitmap_get_cardinality(prVar5);
  uVar6 = roaring_bitmap_and_cardinality(r,r_00);
  _assert_true((ulong)(uVar2 == uVar6),
               "roaring_bitmap_get_cardinality(i1_2) == roaring_bitmap_and_cardinality(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x348);
  roaring_bitmap_free(prVar5);
  sVar3 = roaring_bitmap_portable_size_in_bytes(r);
  uVar11 = sVar3 & 0xffffffff;
  buf = (char *)malloc(uVar11);
  sVar3 = roaring_bitmap_portable_serialize(r,buf);
  _assert_int_equal(sVar3,uVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x350);
  prVar5 = roaring_bitmap_portable_deserialize(buf);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x352);
  }
  _Var1 = roaring_bitmap_equals(r,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, t)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x353);
  roaring_bitmap_free(prVar5);
  sVar3 = roaring_bitmap_portable_deserialize_size(buf,uVar11);
  _assert_true((ulong)(sVar3 == uVar11),"sizeofbitmap == expectedsize",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x35b);
  prVar5 = roaring_bitmap_portable_deserialize_safe(buf,uVar11);
  local_438[0] = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(prVar5,local_438);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_438[0]);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x35e);
  }
  _Var1 = roaring_bitmap_equals(r,prVar5);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, t)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x35f);
  roaring_bitmap_free(prVar5);
  free(buf);
  local_4bc = 0;
  roaring_iterate(r,roaring_iterator_sumall,&local_4bc);
  local_4bc = 0;
  prVar8 = roaring_iterator_create(r);
  if (prVar8->has_value == true) {
    do {
      local_4bc = local_4bc + 1;
      roaring_uint32_iterator_advance(prVar8);
    } while (prVar8->has_value != false);
  }
  roaring_uint32_iterator_free(prVar8);
  uVar2 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar2 == local_4bc),"roaring_bitmap_get_cardinality(r1) == counter",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x377);
  prVar8 = roaring_iterator_create(r);
  do {
    uVar10 = roaring_uint32_iterator_read(prVar8,(uint32_t *)local_438,0x100);
    if (uVar10 == 0) break;
    uVar11 = 0;
    do {
      local_4bc = local_4bc + *(int *)((long)local_438 + uVar11 * 4);
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  } while (0xff < uVar10);
  roaring_uint32_iterator_free(prVar8);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(local_4b8);
  return;
}

Assistant:

void test_example(bool copy_on_write) {
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    assert_bitmap_validate(r1);
    assert_non_null(r1);

    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        roaring_bitmap_add(r1, i);
        assert_bitmap_validate(r1);
    }

    // check whether a value is contained
    assert_true(roaring_bitmap_contains(r1, 500));

    // compute how many bits there are:
    uint32_t cardinality = roaring_bitmap_get_cardinality(r1);
    printf("Cardinality = %d \n", cardinality);

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint32_t size = roaring_bitmap_portable_size_in_bytes(r1);
    roaring_bitmap_run_optimize(r1);
    assert_bitmap_validate(r1);
    uint32_t compact_size = roaring_bitmap_portable_size_in_bytes(r1);

    printf("size before run optimize %d bytes, and after %d bytes\n", size,
           compact_size);

    // create a new bitmap with varargs
    roaring_bitmap_t *r2 = roaring_bitmap_from(1, 2, 3, 5, 6);
    assert_bitmap_validate(r2);
    assert_non_null(r2);

    roaring_bitmap_printf(r2);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    roaring_bitmap_t *r3 = roaring_bitmap_of_ptr(3, values);
    roaring_bitmap_set_copy_on_write(r3, copy_on_write);
    assert_bitmap_validate(r3);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_true(arr1 != NULL);
    roaring_bitmap_to_uint32_array(r1, arr1);

    // we can go from arrays to bitmaps from "offset" by "limit"
    size_t offset = 100;
    size_t limit = 1000;
    uint32_t *arr3 = (uint32_t *)malloc(limit * sizeof(uint32_t));
    assert_true(arr3 != NULL);
    roaring_bitmap_range_uint32_array(r1, offset, limit, arr3);
    free(arr3);

    roaring_bitmap_t *r1f = roaring_bitmap_of_ptr(card1, arr1);
    assert_bitmap_validate(r1f);
    free(arr1);
    assert_non_null(r1f);

    // bitmaps shall be equal
    assert_true(roaring_bitmap_equals(r1, r1f));
    roaring_bitmap_free(r1f);

    // we can copy and compare bitmaps
    roaring_bitmap_t *z = roaring_bitmap_copy(r3);
    roaring_bitmap_set_copy_on_write(z, copy_on_write);
    assert_bitmap_validate(z);
    assert_true(roaring_bitmap_equals(r3, z));

    roaring_bitmap_free(z);

    // we can compute union two-by-two
    roaring_bitmap_t *r1_2_3 = roaring_bitmap_or(r1, r2);
    assert_bitmap_validate(r1_2_3);
    assert_true(roaring_bitmap_get_cardinality(r1_2_3) ==
                roaring_bitmap_or_cardinality(r1, r2));

    roaring_bitmap_set_copy_on_write(r1_2_3, copy_on_write);
    roaring_bitmap_or_inplace(r1_2_3, r3);

    // we can compute a big union
    const roaring_bitmap_t *allmybitmaps[] = {r1, r2, r3};
    roaring_bitmap_t *bigunion = roaring_bitmap_or_many(3, allmybitmaps);
    assert_bitmap_validate(bigunion);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunion));
    roaring_bitmap_t *bigunionheap =
        roaring_bitmap_or_many_heap(3, allmybitmaps);
    assert_bitmap_validate(bigunionheap);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunionheap));
    roaring_bitmap_free(r1_2_3);
    roaring_bitmap_free(bigunion);
    roaring_bitmap_free(bigunionheap);

    // we can compute xor two-by-two
    roaring_bitmap_t *rx1_2_3 = roaring_bitmap_xor(r1, r2);
    roaring_bitmap_set_copy_on_write(rx1_2_3, copy_on_write);
    assert_bitmap_validate(rx1_2_3);
    roaring_bitmap_xor_inplace(rx1_2_3, r3);

    // we can compute a big xor
    const roaring_bitmap_t *allmybitmaps_x[] = {r1, r2, r3};
    roaring_bitmap_t *bigxor = roaring_bitmap_xor_many(3, allmybitmaps_x);
    assert_bitmap_validate(bigxor);
    assert_true(roaring_bitmap_equals(rx1_2_3, bigxor));

    roaring_bitmap_free(rx1_2_3);
    roaring_bitmap_free(bigxor);

    // we can compute intersection two-by-two
    roaring_bitmap_t *i1_2 = roaring_bitmap_and(r1, r2);
    assert_bitmap_validate(i1_2);
    assert_true(roaring_bitmap_get_cardinality(i1_2) ==
                roaring_bitmap_and_cardinality(r1, r2));

    roaring_bitmap_free(i1_2);

    // we can write a bitmap to a pointer and recover it later
    uint32_t expectedsize = roaring_bitmap_portable_size_in_bytes(r1);
    char *serializedbytes = (char *)malloc(expectedsize);
    size_t actualsize = roaring_bitmap_portable_serialize(r1, serializedbytes);
    assert_int_equal(actualsize, expectedsize);
    roaring_bitmap_t *t = roaring_bitmap_portable_deserialize(serializedbytes);
    assert_bitmap_validate(t);
    assert_true(roaring_bitmap_equals(r1, t));
    roaring_bitmap_free(t);
    // we can also check whether there is a bitmap at a memory location without
    // reading it
    size_t sizeofbitmap =
        roaring_bitmap_portable_deserialize_size(serializedbytes, expectedsize);
    assert_true(
        sizeofbitmap ==
        expectedsize);  // sizeofbitmap would be zero if no bitmap were found
    // we can also read the bitmap "safely" by specifying a byte size limit:
    t = roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    assert_bitmap_validate(t);
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);
    free(serializedbytes);

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    roaring_iterate(r1, roaring_iterator_sumall, &counter);

    /**
     * bool roaring_iterator_sumall(uint32_t value, void *param) {
     *        *(uint32_t *) param += value;
     *        return true; // continue till the end
     *  }
     *
     */

    // we can also create iterator structs
    counter = 0;
    roaring_uint32_iterator_t *i = roaring_iterator_create(r1);
    while (i->has_value) {
        counter++;
        roaring_uint32_iterator_advance(i);
    }
    roaring_uint32_iterator_free(i);
    assert_true(roaring_bitmap_get_cardinality(r1) == counter);

    // for greater speed, you can iterate over the data in bulk
    i = roaring_iterator_create(r1);
    uint32_t buffer[256];
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(i, buffer, 256);
        for (uint32_t j = 0; j < ret; j++) {
            counter += buffer[j];
        }
        if (ret < 256) {
            break;
        }
    }
    roaring_uint32_iterator_free(i);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r3);
}